

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminatablethread.cpp
# Opt level: O3

void __thiscall TerminatableThread::~TerminatableThread(TerminatableThread *this)

{
  this->_vptr_TerminatableThread = (_func_int **)&PTR__TerminatableThread_0023fc60;
  if ((this->m_thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->m_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

TerminatableThread::~TerminatableThread() { join(); }